

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O3

Result wabt::ResolveNamesScript(Script *script,Errors *errors)

{
  pointer puVar1;
  _func_int **pp_Var2;
  Enum EVar3;
  AssertModuleCommand<(wabt::CommandType)4> *assert_invalid_command;
  Command *pCVar4;
  pointer puVar5;
  undefined1 local_178 [8];
  NameResolver resolver;
  ExprVisitor local_b8;
  undefined1 local_68 [32];
  undefined1 auStack_48 [8];
  Errors errors_1;
  
  local_178 = (undefined1  [8])&PTR__NameResolver_015463c8;
  resolver.script_ = (Script *)0x0;
  resolver.current_module_ = (Module *)0x0;
  resolver.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)errors;
  resolver.errors_ = (Errors *)script;
  ExprVisitor::ExprVisitor((ExprVisitor *)&resolver.current_func_,(Delegate *)local_178);
  resolver.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  resolver.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._12_8_ = 0;
  resolver.visitor_.expr_iter_stack_.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resolver.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  resolver.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  puVar5 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 == puVar1) {
    EVar3 = Ok;
  }
  else {
    do {
      pCVar4 = (puVar5->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      switch(pCVar4->type) {
      case First:
switchD_00f4ee3c_caseD_0:
        anon_unknown_13::NameResolver::VisitModule((NameResolver *)local_178,(Module *)(pCVar4 + 1))
        ;
        break;
      case AssertInvalid:
        auStack_48 = (undefined1  [8])0x0;
        errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        resolver._144_8_ = &PTR__NameResolver_015463c8;
        ExprVisitor::ExprVisitor(&local_b8,(Delegate *)&resolver.result_);
        local_68._16_4_ = 0;
        local_68._20_8_ = 0;
        local_68._0_8_ = (pointer)0x0;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        pp_Var2 = pCVar4[1]._vptr_Command;
        if ((pp_Var2 != (_func_int **)0x0) && (*(int *)(pp_Var2 + 1) == 0)) {
          anon_unknown_13::NameResolver::VisitModule
                    ((NameResolver *)&resolver.result_,(Module *)(pp_Var2 + 2));
        }
        resolver._144_8_ = &PTR__NameResolver_015463c8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
        if (local_b8.expr_iter_stack_.
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_b8.state_stack_.
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                  ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)auStack_48);
        break;
      case AssertUnlinkable:
      case AssertUninstantiable:
        pCVar4 = (Command *)pCVar4[1]._vptr_Command;
        if ((pCVar4 != (Command *)0x0) && (pCVar4->type == First)) goto switchD_00f4ee3c_caseD_0;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
    EVar3 = (Enum)resolver.labels_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_178 = (undefined1  [8])&PTR__NameResolver_015463c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&resolver.visitor_.expr_iter_stack_.
                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (resolver.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(resolver.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (resolver.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(resolver.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (resolver.visitor_.delegate_ != (Delegate *)0x0) {
    operator_delete(resolver.visitor_.delegate_);
  }
  return (Result)EVar3;
}

Assistant:

Result ResolveNamesScript(Script* script, Errors* errors) {
  NameResolver resolver(script, errors);
  return resolver.VisitScript(script);
}